

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O0

int SetMotorSpeedIM483I(IM483I *pIM483I,int val)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint8 local_438 [4];
  int recvbuflen;
  char recvbuf [512];
  uint8 local_228 [4];
  int sendbuflen;
  char sendbuf [512];
  uint local_1c;
  int val_local;
  IM483I *pIM483I_local;
  
  iVar1 = val;
  if (val < 1) {
    iVar1 = -val;
  }
  if (iVar1 < 0x14) {
    local_1c = 0;
  }
  else if (val < 0x4e21) {
    local_1c = val;
    if (val < -20000) {
      local_1c = 0xffffb1e0;
    }
  }
  else {
    local_1c = 20000;
  }
  memset(local_228,0,0x200);
  sprintf((char *)local_228,"M%d\r",(ulong)local_1c);
  sVar3 = strlen((char *)local_228);
  iVar1 = (int)sVar3;
  iVar2 = WriteDataIM483I(pIM483I,local_228,iVar1,pIM483I->bytedelayus);
  if (iVar2 != 0) {
    printf("Error writing data to a IM483I. \n");
    return 1;
  }
  if ((pIM483I->bSaveRawData != 0) && (pIM483I->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_228,(long)iVar1,1,(FILE *)pIM483I->pfSaveFile);
    fflush((FILE *)pIM483I->pfSaveFile);
  }
  mSleep(0x14);
  if (pIM483I->bCheckState != 0) {
    memset(local_438,0,0x200);
    iVar2 = ReadAllRS232Port(&pIM483I->RS232Port,local_438,iVar1 + 1);
    if (iVar2 != 0) {
      printf("Error reading data from a IM483I. \n");
      return 1;
    }
    if ((pIM483I->bSaveRawData != 0) && (pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_438,(long)(iVar1 + 1),1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    iVar2 = strncmp((char *)local_438,(char *)local_228,(long)iVar1);
    if ((iVar2 != 0) || (local_438[iVar1] != '\n')) {
      printf("Error reading data from a IM483I : Invalid data. \n");
      return 4;
    }
  }
  return 0;
}

Assistant:

inline int SetMotorSpeedIM483I(IM483I* pIM483I, int val)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	if (abs(val) < MIN_MOTOR_SPEED_IM483I) val = 0;
	else if (val > MAX_MOTOR_SPEED_IM483I) val = MAX_MOTOR_SPEED_IM483I;
	else if (val < -MAX_MOTOR_SPEED_IM483I) val = -MAX_MOTOR_SPEED_IM483I;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "M%d\r", val);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(20);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	return EXIT_SUCCESS;
}